

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O3

int fits_relurl2url(char *refURL,char *relURL,char *absURL,int *status)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  char tmpStr [1025];
  char local_438 [1032];
  
  if (*status != 0) {
    return *status;
  }
  pcVar6 = local_438;
  sVar3 = strlen(refURL);
  if (sVar3 < 0x401) {
    strcpy(local_438,refURL);
    iVar2 = fits_strncasecmp(local_438,"MEM:",4);
    if (iVar2 != 0) {
      iVar2 = fits_strncasecmp(local_438,"SHMEM:",6);
      if (iVar2 != 0) {
        if (*relURL == '/') {
          absURL[0] = '/';
          absURL[1] = '\0';
          if (*relURL == '/') {
            pcVar4 = relURL + 1;
            do {
              sVar3 = strlen(absURL);
              if (sVar3 - 0x400 < 0xfffffffffffffbff) {
                *absURL = '\0';
                pcVar6 = "abs URL is too long (fits_relurl2url)";
                goto LAB_00171649;
              }
              sVar3 = strlen(absURL);
              (absURL + sVar3)[0] = '/';
              (absURL + sVar3)[1] = '\0';
              cVar1 = *pcVar4;
              pcVar4 = pcVar4 + 1;
            } while (cVar1 == '/');
          }
          sVar3 = strlen(absURL);
          pcVar4 = strstr(local_438,absURL);
          if (pcVar4 != (char *)0x0) {
            do {
              pcVar6 = pcVar4 + ((long)(sVar3 << 0x20) >> 0x20);
              pcVar4 = strstr(pcVar6,absURL);
            } while (pcVar4 != (char *)0x0);
          }
          absURL[(long)((sVar3 << 0x20) + -0x100000000) >> 0x20] = '\0';
          pcVar4 = strstr(pcVar6,absURL);
          if (pcVar4 == (char *)0x0) {
            pcVar4 = strrchr(pcVar6,0x2f);
            if (pcVar4 == (char *)0x0) goto LAB_001715f1;
          }
          *pcVar4 = '\0';
        }
        else {
          pcVar6 = strrchr(local_438,0x2f);
          if (pcVar6 == (char *)0x0) {
LAB_001715f1:
            local_438[0] = '\0';
          }
          else {
            pcVar6[1] = '\0';
          }
        }
        sVar3 = strlen(local_438);
        sVar5 = strlen(relURL);
        if (sVar5 + sVar3 < 0x401) {
          strcat(local_438,relURL);
          iVar2 = fits_clean_url(local_438,absURL,status);
          goto LAB_00171653;
        }
        *absURL = '\0';
        pcVar6 = "rel + ref URL is too long (fits_relurl2url)";
        goto LAB_00171649;
      }
    }
    ffpmsg("ref URL has access mem:// or shmem:// (fits_relurl2url)");
    ffpmsg("   cannot construct full URL from a partial URL and ");
    pcVar6 = "   MEM/SHMEM base URL";
  }
  else {
    *absURL = '\0';
    pcVar6 = "ref URL is too long (fits_relurl2url)";
  }
LAB_00171649:
  ffpmsg(pcVar6);
  iVar2 = 0x7d;
LAB_00171653:
  *status = iVar2;
  return iVar2;
}

Assistant:

int fits_relurl2url(char     *refURL, /* I reference URL string             */
		    char     *relURL, /* I relative URL string to process   */
		    char     *absURL, /* O absolute URL string              */
		    int      *status)
/*
  create an absolute URL from a relative url and a reference URL. The 
  reference URL is given by the FITS file pointed to by fptr.

  The construction of the absolute URL from the partial and reference URl
  is performed using the rules set forth in:
 
  http://www.w3.org/Addressing/URL/URL_TOC.html
  and
  http://www.w3.org/Addressing/URL/4_3_Partial.html

  Note that the relative URL string relURL must conform to the Unix-like
  URL syntax; host dependent partial URL strings are not allowed.
*/
{
  int i;

  char tmpStr[FLEN_FILENAME];

  char *tmpStr1, *tmpStr2;


  if(*status != 0) return(*status);
  
  do
    {

      /*
	make a copy of the reference URL string refURL for parsing purposes
      */

      if (strlen(refURL) > FLEN_FILENAME-1)
      {
         absURL[0]=0;
         ffpmsg("ref URL is too long (fits_relurl2url)");
         *status = URL_PARSE_ERROR;
         continue;
      }
      strcpy(tmpStr,refURL);

      /*
	if the reference file has an access method of mem:// or shmem://
	then we cannot use it as the basis of an absolute URL construction
	for a partial URL
      */
	  
      if(fits_strncasecmp(tmpStr,"MEM:",4)   == 0 ||
                	                fits_strncasecmp(tmpStr,"SHMEM:",6) == 0)
	{
	  ffpmsg("ref URL has access mem:// or shmem:// (fits_relurl2url)");
	  ffpmsg("   cannot construct full URL from a partial URL and ");
	  ffpmsg("   MEM/SHMEM base URL");
	  *status = URL_PARSE_ERROR;
	  continue;
	}

      if(relURL[0] != '/')
	{
	  /*
	    just append the relative URL string to the reference URL
	    string (minus the reference URL file name) to form the 
	    absolute URL string
	  */
	      
	  tmpStr1 = strrchr(tmpStr,'/');
	  
	  if(tmpStr1 != NULL) tmpStr1[1] = 0;
	  else                tmpStr[0]  = 0;
	  
          if (strlen(tmpStr)+strlen(relURL) > FLEN_FILENAME-1)
          {
              absURL[0]=0;
              ffpmsg("rel + ref URL is too long (fits_relurl2url)");
              *status = URL_PARSE_ERROR;
              continue;
          }
	  strcat(tmpStr,relURL);
	}
      else
	{
	  /*
	    have to parse the refURL string for the first occurnace of the 
	    same number of '/' characters as contained in the beginning of
	    location that is not followed by a greater number of consective 
	    '/' charaters (yes, that is a confusing statement); this is the 
	    location in the refURL string where the relURL string is to
	    be appended to form the new absolute URL string
	   */
	  
	  /*
	    first, build up a slash pattern string that has one more
	    slash in it than the starting slash pattern of the
	    relURL string
	  */
	  
	  strcpy(absURL,"/");
	  
	  for(i = 0; relURL[i] == '/'; ++i) 
          {
             if (strlen(absURL) + 1 > FLEN_FILENAME-1)
             {
                 absURL[0]=0;
                 ffpmsg("abs URL is too long (fits_relurl2url)");
                 *status = URL_PARSE_ERROR;
                 return (*status);
             }
             strcat(absURL,"/");
          }
	  
	  /*
	    loop over the refURL string until the slash pattern stored
	    in absURL is no longer found
	  */

	  for(tmpStr1 = tmpStr, i = strlen(absURL); 
	      (tmpStr2 = strstr(tmpStr1,absURL)) != NULL;
	      tmpStr1 = tmpStr2 + i);
	  
	  /* reduce the slash pattern string by one slash */
	  
	  absURL[i-1] = 0;
	  
	  /* 
	     search for the slash pattern in the remaining portion
	     of the refURL string
	  */

	  tmpStr2 = strstr(tmpStr1,absURL);
	  
	  /* if no slash pattern match was found */
	  
	  if(tmpStr2 == NULL)
	    {
	      /* just strip off the file name from the refURL  */
	      
	      tmpStr2 = strrchr(tmpStr1,'/');
	      
	      if(tmpStr2 != NULL) tmpStr2[0] = 0;
	      else                tmpStr[0]  = 0;
	    }
	  else
	    {
	      /* set a string terminator at the slash pattern match */
	      
	      *tmpStr2 = 0;
	    }
	  
	  /* 
	    conatenate the relURL string to the refURL string to form
	    the absURL
	   */

          if (strlen(tmpStr)+strlen(relURL) > FLEN_FILENAME-1)
          {
              absURL[0]=0;
              ffpmsg("rel + ref URL is too long (fits_relurl2url)");
              *status = URL_PARSE_ERROR;
              continue;
          }
	  strcat(tmpStr,relURL);
	}

      /*
	normalize the absURL by removing any ".." or "." specifiers
	in the string
      */

      *status = fits_clean_url(tmpStr,absURL,status);

    }while(0);

  return(*status);
}